

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringExtras.h
# Opt level: O2

string * __thiscall
llvm::utohexstr_abi_cxx11_(string *__return_storage_ptr__,llvm *this,uint64_t X,bool LowerCase)

{
  char cVar1;
  undefined1 *puVar2;
  char cVar3;
  uint uVar4;
  char Buffer [17];
  undefined1 local_18;
  undefined1 local_17 [15];
  
  puVar2 = local_17;
  if (this == (llvm *)0x0) {
    puVar2 = &local_18;
    local_18 = 0x30;
  }
  for (; this != (llvm *)0x0; this = (llvm *)((ulong)this >> 4)) {
    uVar4 = (uint)this & 0xf;
    cVar1 = (char)uVar4;
    cVar3 = cVar1 + '0';
    if (9 < uVar4) {
      cVar3 = (char)X * ' ' + '7' + cVar1;
    }
    puVar2[-1] = cVar3;
    puVar2 = puVar2 + -1;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>((string *)__return_storage_ptr__,puVar2);
  return __return_storage_ptr__;
}

Assistant:

inline std::string utohexstr(uint64_t X, bool LowerCase = false) {
  char Buffer[17];
  char *BufPtr = std::end(Buffer);

  if (X == 0) *--BufPtr = '0';

  while (X) {
    unsigned char Mod = static_cast<unsigned char>(X) & 15;
    *--BufPtr = hexdigit(Mod, LowerCase);
    X >>= 4;
  }

  return std::string(BufPtr, std::end(Buffer));
}